

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# audio-logger.cpp
# Opt level: O0

bool __thiscall AudioLogger::isValidBufferSize(AudioLogger *this,float bufferSize_s)

{
  float in_XMM0_Da;
  bool local_1;
  
  if (0.0 < in_XMM0_Da) {
    if (in_XMM0_Da <= 5.0) {
      local_1 = true;
    }
    else {
      fprintf(_stderr,"error : invalid record size requested - %g s. max allowed is %g s\n",
              (double)in_XMM0_Da,0x4014000000000000);
      local_1 = false;
    }
  }
  else {
    fprintf(_stderr,"error : invalid bufferSize_s = %g\n",(double)in_XMM0_Da);
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool AudioLogger::isValidBufferSize(float bufferSize_s) const {
    if (bufferSize_s <= 0) {
        fprintf(stderr, "error : invalid bufferSize_s = %g\n", bufferSize_s);
        return false;
    }

    if (bufferSize_s > kMaxBufferSize_s) {
        fprintf(stderr, "error : invalid record size requested - %g s. max allowed is %g s\n", bufferSize_s, kMaxBufferSize_s);
        return false;
    }

    return true;
}